

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  undefined1 auVar7 [16];
  int iVar8;
  char cVar9;
  uint uVar10;
  numpunct *pnVar11;
  ulong uVar12;
  buffer_appender<char> bVar13;
  int iVar14;
  long *plVar15;
  int iVar16;
  buffer<char> *buf;
  int iVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar21;
  char *pcVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  long *local_298;
  long local_290;
  long local_288;
  char acStack_27a [50];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar11 + 0x20))(&local_298,pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (local_290 == 0) {
    on_dec(this);
    goto LAB_0011c922;
  }
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  cVar9 = (**(code **)(*(long *)pnVar11 + 0x18))(pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (cVar9 == '\0') {
    on_dec(this);
    goto LAB_0011c922;
  }
  puVar1 = &this->abs_value;
  uVar24 = (ulong)*puVar1;
  uVar12 = *(ulong *)((long)&this->abs_value + 8);
  auVar7 = (undefined1  [16])*puVar1;
  auVar26 = (undefined1  [16])*puVar1;
  uVar23 = 1;
  if ((uVar24 < 10) <= uVar12) {
    uVar23 = 4;
    auVar25 = auVar26;
    do {
      uVar21 = auVar25._8_8_;
      uVar19 = auVar25._0_8_;
      iVar14 = (int)uVar23;
      if (uVar21 == 0 && (ulong)(99 < uVar19) <= -uVar21) {
        uVar23 = (ulong)(iVar14 - 2);
        goto LAB_0011c5cc;
      }
      if (uVar21 == 0 && (ulong)(999 < uVar19) <= -uVar21) {
        uVar23 = (ulong)(iVar14 - 1);
        goto LAB_0011c5cc;
      }
      if (uVar21 < (uVar19 < 10000)) goto LAB_0011c5cc;
      auVar25 = __udivti3(uVar19,uVar21,10000,0);
      uVar23 = (ulong)(iVar14 + 4);
    } while (uVar21 != 0 || -uVar21 < (ulong)(99999 < uVar19));
    uVar23 = (ulong)(iVar14 + 1);
  }
LAB_0011c5cc:
  iVar14 = (int)uVar23;
  plVar15 = local_298;
  uVar19 = uVar23;
  uVar21 = uVar23;
  if (local_290 == 0) {
LAB_0011c615:
    iVar17 = (int)uVar21;
    uVar10 = (uint)uVar19;
    if (plVar15 == (long *)((long)local_298 + local_290)) goto LAB_0011c620;
  }
  else {
    iVar17 = iVar14 + (int)local_290;
    lVar18 = local_290;
    do {
      cVar3 = (char)*plVar15;
      uVar10 = (int)uVar19 - (int)cVar3;
      if ((uVar10 == 0 || (int)uVar19 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
      goto LAB_0011c615;
      uVar21 = (ulong)((int)uVar21 + 1);
      plVar15 = (long *)((long)plVar15 + 1);
      uVar19 = (ulong)uVar10;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
LAB_0011c620:
    iVar17 = (int)(uVar10 - 1) / (int)*(char *)((long)local_298 + local_290 + -1) + iVar17;
  }
  iVar16 = 1;
  if ((uVar24 < 10) <= uVar12) {
    iVar8 = 4;
    auVar25 = auVar26;
    do {
      iVar16 = iVar8;
      uVar21 = auVar25._8_8_;
      uVar19 = auVar25._0_8_;
      if (uVar21 == 0 && (ulong)(99 < uVar19) <= -uVar21) {
        iVar16 = iVar16 + -2;
        goto LAB_0011c6c3;
      }
      if (uVar21 == 0 && (ulong)(999 < uVar19) <= -uVar21) {
        iVar16 = iVar16 + -1;
        goto LAB_0011c6c3;
      }
      if (uVar21 < (uVar19 < 10000)) goto LAB_0011c6c3;
      auVar25 = __udivti3(uVar19,uVar21,10000,0);
      iVar8 = iVar16 + 4;
    } while (uVar21 != 0 || -uVar21 < (ulong)(99999 < uVar19));
    iVar16 = iVar16 + 1;
  }
LAB_0011c6c3:
  if (iVar14 < iVar16) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/format.h"
                ,0x41b,"invalid digit count");
  }
  pcVar22 = acStack_27a + (long)iVar14 + 2;
  pcVar20 = pcVar22;
  if ((uVar24 < 100) <= uVar12) {
    do {
      lVar18 = auVar26._8_8_;
      uVar24 = auVar26._0_8_;
      pcVar22 = pcVar20 + -2;
      auVar26 = __udivti3(uVar24,lVar18,100,0);
      *(undefined2 *)(pcVar20 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (uVar24 + auVar26._0_8_ * -100) * 2);
      pcVar20 = pcVar22;
      auVar7 = auVar26;
    } while (lVar18 != 0 || (ulong)-lVar18 < (ulong)(9999 < uVar24));
  }
  if (auVar7._8_8_ == 0 && (ulong)(9 < auVar7._0_8_) <= (ulong)-auVar7._8_8_) {
    pcVar22[-1] = auVar7[0] | 0x30;
  }
  else {
    *(undefined2 *)(pcVar22 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar7._0_8_ * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00147f10;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar10 = iVar17 + this->prefix_size;
  if (-1 < (int)uVar10) {
    uVar24 = (ulong)uVar10;
    if (500 < uVar10) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar24);
    }
    pcVar22 = local_248.super_buffer<char>.ptr_;
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (uVar24 <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = uVar24;
    }
    pcVar20 = local_248.super_buffer<char>.ptr_ + (uVar24 - 1);
    if (1 < iVar14) {
      uVar23 = uVar23 + 1;
      iVar14 = 0;
      plVar15 = local_298;
      do {
        pcVar2 = pcVar20 + -1;
        *pcVar20 = acStack_27a[uVar23];
        cVar3 = (char)*plVar15;
        if ('\0' < cVar3) {
          iVar14 = iVar14 + 1;
          if ((cVar3 != '\x7f') && (iVar14 % (int)cVar3 == 0)) {
            if ((long *)((long)plVar15 + 1) != (long *)((long)local_298 + local_290)) {
              iVar14 = 0;
              plVar15 = (long *)((long)plVar15 + 1);
            }
            pcVar20[-1] = cVar9;
            pcVar2 = pcVar20 + -2;
          }
        }
        pcVar20 = pcVar2;
        uVar23 = uVar23 - 1;
      } while (2 < uVar23);
    }
    *pcVar20 = acStack_27a[2];
    if (this->prefix_size != 0) {
      pcVar20[-1] = '-';
    }
    pbVar6 = this->specs;
    uVar12 = (ulong)pbVar6->width;
    if (-1 < (long)uVar12) {
      uVar23 = 0;
      if (uVar24 <= uVar12) {
        uVar23 = uVar12 - uVar24;
      }
      bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar4 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar6->field_0x9 & 0xf));
      if (*(ulong *)((long)bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + uVar24 + (pbVar6->fill).size_ * uVar23) {
        (*(code *)**(undefined8 **)
                    bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar12 = uVar23 >> (bVar4 & 0x3f);
      bVar13 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar13,uVar12,&pbVar6->fill);
      bVar13 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (pcVar22,pcVar22 + uVar24,bVar13);
      bVar13 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar13,uVar23 - uVar12,&pbVar6->fill);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
LAB_0011c922:
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/core.h"
              ,0x146,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }